

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::VariableStatement<tcu::Vector<float,_2>_>::doExecute
          (VariableStatement<tcu::Vector<float,_2>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Vector<float,_2>_> *variable;
  Expr<tcu::Vector<float,_2>_> *pEVar1;
  IVal *pIVar2;
  IVal local_50;
  
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Vector<float,_2>_>.
             super_ExprPBase<tcu::Vector<float,_2>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_50,pEVar1,ctx);
    Environment::bind<tcu::Vector<float,2>>(this_00,variable,&local_50);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Vector<float,_2>_>.
             super_ExprPBase<tcu::Vector<float,_2>_>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_50,pEVar1,ctx);
    pIVar2 = Environment::lookup<tcu::Vector<float,2>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                                 .m_ptr);
    pIVar2->m_data[0].m_hasNaN = local_50.m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar2->m_data[0].field_0x1 = local_50.m_data[0]._1_7_;
    pIVar2->m_data[0].m_lo = local_50.m_data[0].m_lo;
    pIVar2->m_data[0].m_hi = local_50.m_data[0].m_hi;
    pIVar2->m_data[1].m_hasNaN = local_50.m_data[1].m_hasNaN;
    *(undefined7 *)&pIVar2->m_data[1].field_0x1 = local_50.m_data[1]._1_7_;
    pIVar2->m_data[1].m_lo = local_50.m_data[1].m_lo;
    pIVar2->m_data[1].m_hi = local_50.m_data[1].m_hi;
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}